

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_ring_buffer.cc
# Opt level: O0

void __thiscall
webrtc::AudioRingBuffer::Write(AudioRingBuffer *this,float **data,size_t channels,size_t frames)

{
  reference ppRVar1;
  FatalMessage local_350;
  string *local_1d8;
  string *_result_1;
  size_t written;
  size_t i;
  FatalMessage local_1b0;
  size_type local_38;
  string *local_30;
  string *_result;
  size_t frames_local;
  size_t channels_local;
  float **data_local;
  AudioRingBuffer *this_local;
  
  _result = (string *)frames;
  frames_local = channels;
  channels_local = (size_t)data;
  data_local = (float **)this;
  local_38 = std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>::size(&this->buffers_);
  local_30 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&local_38,&frames_local,"buffers_.size() == channels");
  if (local_30 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
               ,0x21,local_30);
    rtc::FatalMessage::stream(&local_1b0);
    rtc::FatalMessage::~FatalMessage(&local_1b0);
  }
  written = 0;
  local_30 = (string *)0x0;
  while( true ) {
    if (frames_local <= written) {
      return;
    }
    ppRVar1 = std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>::operator[]
                        (&this->buffers_,written);
    _result_1 = (string *)
                WebRtc_WriteBuffer(*ppRVar1,*(void **)(channels_local + written * 8),(size_t)_result
                                  );
    local_1d8 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&_result_1,(unsigned_long *)&_result,"written == frames"
                          );
    if (local_1d8 != (string *)0x0) break;
    written = written + 1;
    local_1d8 = (string *)0x0;
  }
  rtc::FatalMessage::FatalMessage
            (&local_350,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
             ,0x24,local_1d8);
  rtc::FatalMessage::stream(&local_350);
  rtc::FatalMessage::~FatalMessage(&local_350);
}

Assistant:

void AudioRingBuffer::Write(const float* const* data, size_t channels,
                            size_t frames) {
  RTC_DCHECK_EQ(buffers_.size(), channels);
  for (size_t i = 0; i < channels; ++i) {
    const size_t written = WebRtc_WriteBuffer(buffers_[i], data[i], frames);
    RTC_CHECK_EQ(written, frames);
  }
}